

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
          (ShaderPerformanceCaseGroup *this,TestContext *testCtx,char *name,char *description)

{
  InitialCalibration *ptr;
  
  tcu::TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,testCtx,name,description);
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPerformanceCaseGroup_00729278;
  ptr = (InitialCalibration *)operator_new(4);
  ptr->initialNumCalls = 1;
  de::SharedPtr<deqp::gls::ShaderPerformanceCase::InitialCalibration>::SharedPtr
            (&this->m_initialCalibrationStorage,ptr);
  return;
}

Assistant:

ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup (tcu::TestContext& testCtx, const char* name, const char* description)
	: TestCaseGroup					(testCtx, name, description)
	, m_initialCalibrationStorage	(new ShaderPerformanceCase::InitialCalibration)
{
}